

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode cr_lc_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                   _Bool *peos)

{
  void *pvVar1;
  long lVar2;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  void *pvVar6;
  byte bVar7;
  ulong uVar8;
  bufq *q;
  size_t sVar9;
  ulong uVar10;
  _Bool eos;
  size_t *local_68;
  _Bool *local_60;
  bufq *local_58;
  size_t local_50;
  char *local_48;
  size_t nread;
  size_t n;
  
  pvVar1 = reader->ctx;
  if ((*(byte *)((long)pvVar1 + 0x60) & 2) != 0) {
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  q = (bufq *)((long)pvVar1 + 0x20);
  local_68 = pnread;
  local_60 = peos;
  local_50 = blen;
  _Var4 = Curl_bufq_is_empty(q);
  if (_Var4) {
    if ((*(byte *)((long)pvVar1 + 0x60) & 1) != 0) {
      *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
      *local_68 = 0;
      *local_60 = true;
      return CURLE_OK;
    }
    CVar5 = Curl_creader_read(data,reader->next,buf,local_50,&nread,&eos);
    sVar9 = nread;
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    bVar7 = *(byte *)((long)pvVar1 + 0x60) & 0xfe | eos;
    *(byte *)((long)pvVar1 + 0x60) = bVar7;
    if ((nread != 0) && (pvVar6 = memchr(buf,10,nread), pvVar6 != (void *)0x0)) {
      uVar8 = 0;
      local_58 = q;
      local_48 = buf;
      for (uVar10 = 0; uVar10 < sVar9; uVar10 = uVar10 + 1) {
        if ((buf[uVar10] == '\n') && ((*(byte *)((long)pvVar1 + 0x60) & 4) == 0)) {
          CVar5 = Curl_bufq_cwrite(q,buf + uVar8,uVar10 - uVar8,&n);
          if (CVar5 != CURLE_OK) {
            return CVar5;
          }
          CVar5 = Curl_bufq_cwrite(q,"\r\n",2,&n);
          if (CVar5 != CURLE_OK) {
            return CVar5;
          }
          uVar8 = uVar10 + 1;
          buf = local_48;
          q = local_58;
          if ((((data->set).field_0x8ca & 0x20) == 0) &&
             (lVar2 = (data->state).infilesize, lVar2 != -1)) {
            (data->state).infilesize = lVar2 + 1;
          }
        }
        else {
          *(byte *)((long)pvVar1 + 0x60) =
               *(byte *)((long)pvVar1 + 0x60) & 0xfb | (buf[uVar10] == '\r') << 2;
        }
        sVar9 = nread;
      }
      if ((uVar8 <= uVar10 && uVar10 - uVar8 != 0) &&
         (CVar5 = Curl_bufq_cwrite(q,buf + uVar8,uVar10 - uVar8,&n), CVar5 != CURLE_OK)) {
        return CVar5;
      }
      goto LAB_0014ad9b;
    }
    if (eos != false) {
      *(byte *)((long)pvVar1 + 0x60) = bVar7 | 2;
    }
    *local_68 = sVar9;
    _Var4 = (_Bool)(*(byte *)((long)pvVar1 + 0x60) >> 1 & 1);
  }
  else {
LAB_0014ad9b:
    *local_60 = false;
    CVar5 = Curl_bufq_cread(q,buf,local_50,local_68);
    uVar10 = (ulong)CVar5;
    if (((CVar5 != CURLE_OK) || (uVar10 = 0, (*(byte *)((long)pvVar1 + 0x60) & 1) == 0)) ||
       (_Var4 = Curl_bufq_is_empty(q), !_Var4)) goto LAB_0014ade6;
    *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
    _Var4 = true;
  }
  *local_60 = _Var4;
  uVar10 = 0;
LAB_0014ade6:
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",local_50,uVar10,*local_68,
                  (ulong)*local_60);
  }
  return (CURLcode)uVar10;
}

Assistant:

static CURLcode cr_lc_read(struct Curl_easy *data,
                           struct Curl_creader *reader,
                           char *buf, size_t blen,
                           size_t *pnread, bool *peos)
{
  struct cr_lc_ctx *ctx = reader->ctx;
  CURLcode result;
  size_t nread, i, start, n;
  bool eos;

  if(ctx->eos) {
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }

  if(Curl_bufq_is_empty(&ctx->buf)) {
    if(ctx->read_eos) {
      ctx->eos = TRUE;
      *pnread = 0;
      *peos = TRUE;
      return CURLE_OK;
    }
    /* Still getting data form the next reader, ctx->buf is empty */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;
    ctx->read_eos = eos;

    if(!nread || !memchr(buf, '\n', nread)) {
      /* nothing to convert, return this right away */
      if(ctx->read_eos)
        ctx->eos = TRUE;
      *pnread = nread;
      *peos = ctx->eos;
      goto out;
    }

    /* at least one \n might need conversion to '\r\n', place into ctx->buf */
    for(i = start = 0; i < nread; ++i) {
      /* if this byte is not an LF character, or if the preceding character is
         a CR (meaning this already is a CRLF pair), go to next */
      if((buf[i] != '\n') || ctx->prev_cr) {
        ctx->prev_cr = (buf[i] == '\r');
        continue;
      }
      ctx->prev_cr = FALSE;
      /* on a soft limit bufq, we do not need to check length */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(!result)
        result = Curl_bufq_cwrite(&ctx->buf, STRCONST("\r\n"), &n);
      if(result)
        return result;
      start = i + 1;
      if(!data->set.crlf && (data->state.infilesize != -1)) {
        /* we are here only because FTP is in ASCII mode...
           bump infilesize for the LF we just added */
        data->state.infilesize++;
        /* comment: this might work for FTP, but in HTTP we could not change
         * the content length after having started the request... */
      }
    }

    if(start < i) { /* leftover */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(result)
        return result;
    }
  }

  DEBUGASSERT(!Curl_bufq_is_empty(&ctx->buf));
  *peos = FALSE;
  result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  if(!result && ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
    *peos = TRUE;
  }

out:
  CURL_TRC_READ(data, "cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",
                blen, result, *pnread, *peos);
  return result;
}